

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  _Alloc_hider _Var2;
  char local_41;
  string local_40;
  
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    if ((this->field_0x68 & 2) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    if (local_40._M_string_length != 0) {
      _Var2._M_p = local_40._M_dataplus._M_p;
      do {
        local_41 = *_Var2._M_p;
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,&local_41,1);
        if (((*_Var2._M_p == '\n') &&
            (_Var2._M_p != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
           (_Var2._M_p[1] == '/')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->document_,(this->indentString_)._M_dataplus._M_p,
                     (this->indentString_)._M_string_length);
        }
        _Var2._M_p = _Var2._M_p + 1;
      } while (_Var2._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
    }
    this->field_0x68 = this->field_0x68 & 0xfd;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void StyledStreamWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_) writeIndent();
  const std::string& comment = root.getComment(commentBefore);
  std::string::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *document_ << *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would include newline
      *document_ << indentString_;
    ++iter;
  }
  indented_ = false;
}